

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

ExpandMacroResult
anon_unknown.dwarf_66c1eb::ExpandMacros
          (string *out,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *macroExpanders,int version)

{
  char cVar1;
  _Any_data *p_Var2;
  int iVar3;
  ExpandMacroResult EVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Any_data *p_Var6;
  char *pcVar7;
  char *pcVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string macroNamespace;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  EVar4 = Ok;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_64 = version;
  local_38 = macroExpanders;
  if (out->_M_string_length != 0) {
    pcVar8 = (out->_M_dataplus)._M_p;
    pcVar7 = pcVar8 + out->_M_string_length;
    local_40 = out;
    do {
      cVar1 = *pcVar8;
      if (EVar4 == Error) {
        if (cVar1 == '}') {
          p_Var6 = (_Any_data *)
                   (local_38->
                   super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          p_Var2 = (_Any_data *)
                   (local_38->
                   super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (p_Var6 == p_Var2) {
              iVar3 = std::__cxx11::string::compare((char *)&local_b8);
              EVar4 = Error - (iVar3 == 0);
              goto LAB_00222860;
            }
            local_98._M_len = CONCAT44(local_98._M_len._4_4_,local_64);
            if (*(long *)(p_Var6 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            EVar4 = (**(code **)(p_Var6->_M_pod_data + 0x18))
                              (p_Var6,&local_b8,&local_60,&local_88,(int *)&local_98);
            if (EVar4 != Ignore) break;
            p_Var6 = p_Var6 + 2;
          }
          if (EVar4 != Ok) goto LAB_00222860;
          local_b8._M_string_length = 0;
          *local_b8._M_dataplus._M_p = '\0';
          pbVar5 = &local_60;
LAB_002227c8:
          pbVar5->_M_string_length = 0;
          *(pbVar5->_M_dataplus)._M_p = '\0';
          EVar4 = Ok;
        }
        else {
          EVar4 = Error;
          std::__cxx11::string::push_back((char)&local_60);
        }
      }
      else if (EVar4 == Ignore) {
        if (cVar1 == '{') {
          iVar3 = std::__cxx11::string::compare((char *)&local_b8);
          EVar4 = Error;
          if ((((iVar3 != 0) &&
               (iVar3 = std::__cxx11::string::compare((char *)&local_b8), iVar3 != 0)) &&
              (iVar3 = std::__cxx11::string::compare((char *)&local_b8), iVar3 != 0)) &&
             (iVar3 = std::__cxx11::string::compare((char *)&local_b8), iVar3 != 0)) {
            std::__cxx11::string::push_back((char)&local_88);
            std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
            std::__cxx11::string::push_back((char)&local_88);
            pbVar5 = &local_b8;
            goto LAB_002227c8;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_b8);
          local_98._M_len = 0;
          local_98._M_str = "";
          __str._M_str = local_b8._M_dataplus._M_p;
          __str._M_len = local_b8._M_string_length;
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_98,0,local_b8._M_string_length,__str);
          EVar4 = Ignore;
          if (iVar3 != 0) {
            local_98._M_len = 3;
            local_98._M_str = "env";
            __str_00._M_str = local_b8._M_dataplus._M_p;
            __str_00._M_len = local_b8._M_string_length;
            iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&local_98,0,local_b8._M_string_length,__str_00);
            if (iVar3 != 0) {
              local_98._M_len = 4;
              local_98._M_str = "penv";
              __str_01._M_str = local_b8._M_dataplus._M_p;
              __str_01._M_len = local_b8._M_string_length;
              iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_98,0,local_b8._M_string_length,__str_01);
              if (iVar3 != 0) {
                local_98._M_len = 6;
                local_98._M_str = "vendor";
                __str_02._M_str = local_b8._M_dataplus._M_p;
                __str_02._M_len = local_b8._M_string_length;
                iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  (&local_98,0,local_b8._M_string_length,__str_02);
                if (iVar3 != 0) {
                  std::__cxx11::string::push_back((char)&local_88);
                  std::__cxx11::string::_M_append
                            ((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
                  pbVar5 = &local_b8;
                  goto LAB_002227c8;
                }
              }
            }
          }
        }
      }
      else {
        EVar4 = Ignore;
        if (cVar1 != '$') {
          EVar4 = Ok;
          std::__cxx11::string::push_back((char)&local_88);
        }
      }
      out = local_40;
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar7);
    if (EVar4 == Error) goto LAB_00222860;
    if (EVar4 == Ignore) {
      std::__cxx11::string::push_back((char)&local_88);
      std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b8._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::operator=((string *)out,(string *)&local_88);
  EVar4 = Ok;
LAB_00222860:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return EVar4;
}

Assistant:

ExpandMacroResult ExpandMacros(
  std::string& out, const std::vector<MacroExpander>& macroExpanders,
  int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}